

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O1

ostream * pstore::repo::operator<<(ostream *os,internal_fixup *ifx)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ section:",10);
  poVar1 = operator<<(os,ifx->section);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", type:",7);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", offset:",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", addend:",9);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  uStack_18 = CONCAT17(0x7d,(undefined7)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 7),1);
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, internal_fixup const & ifx) {
            return os << "{ section:" << ifx.section
                      << ", type:" << static_cast<unsigned> (ifx.type) << ", offset:" << ifx.offset
                      << ", addend:" << ifx.addend << '}';
        }